

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DisconnectMethod(sqlite3_vtab *pVtab)

{
  long lVar1;
  
  sqlite3_finalize((sqlite3_stmt *)pVtab[0x11].zErrMsg);
  for (lVar1 = 0xd; lVar1 != 0x35; lVar1 = lVar1 + 1) {
    sqlite3_finalize((sqlite3_stmt *)(&pVtab->pModule)[lVar1]);
  }
  sqlite3_free(*(void **)&pVtab[0x13].nRef);
  sqlite3_free(pVtab[0x12].pModule);
  sqlite3_free(*(void **)&pVtab[0x12].nRef);
  sqlite3_free(*(void **)&pVtab[3].nRef);
  sqlite3_free(pVtab[3].zErrMsg);
  (**(code **)(*(long *)pVtab[3].pModule + 0x10))();
  sqlite3_free(pVtab);
  return 0;
}

Assistant:

static int fts3DisconnectMethod(sqlite3_vtab *pVtab){
  Fts3Table *p = (Fts3Table *)pVtab;
  int i;

  assert( p->nPendingData==0 );
  assert( p->pSegments==0 );

  /* Free any prepared statements held */
  sqlite3_finalize(p->pSeekStmt);
  for(i=0; i<SizeofArray(p->aStmt); i++){
    sqlite3_finalize(p->aStmt[i]);
  }
  sqlite3_free(p->zSegmentsTbl);
  sqlite3_free(p->zReadExprlist);
  sqlite3_free(p->zWriteExprlist);
  sqlite3_free(p->zContentTbl);
  sqlite3_free(p->zLanguageid);

  /* Invoke the tokenizer destructor to free the tokenizer. */
  p->pTokenizer->pModule->xDestroy(p->pTokenizer);

  sqlite3_free(p);
  return SQLITE_OK;
}